

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O3

void TestConstExpr::ConstCastTestT<short>(void)

{
  if (ConstCastTestT<short>()::b == '\0') {
    ConstCastTestT<short>();
  }
  if (ConstCastTestT<short>()::w == '\0') {
    ConstCastTestT<short>();
  }
  if (ConstCastTestT<short>()::c == '\0') {
    ConstCastTestT<short>();
  }
  if (ConstCastTestT<short>()::sc == '\0') {
    ConstCastTestT<short>();
  }
  if (ConstCastTestT<short>()::uc == '\0') {
    ConstCastTestT<short>();
  }
  if (ConstCastTestT<short>()::s == '\0') {
    ConstCastTestT<short>();
  }
  if (ConstCastTestT<short>()::us == '\0') {
    ConstCastTestT<short>();
  }
  if (ConstCastTestT<short>()::i == '\0') {
    ConstCastTestT<short>();
  }
  if (ConstCastTestT<short>()::ui == '\0') {
    ConstCastTestT<short>();
  }
  if (ConstCastTestT<short>()::l == '\0') {
    ConstCastTestT<short>();
  }
  if (ConstCastTestT<short>()::ul == '\0') {
    ConstCastTestT<short>();
  }
  if (ConstCastTestT<short>()::ll == '\0') {
    ConstCastTestT<short>();
  }
  if (ConstCastTestT<short>()::ull == '\0') {
    ConstCastTestT<short>();
  }
  if (ConstCastTestT<short>()::st == '\0') {
    ConstCastTestT<short>();
  }
  if (ConstCastTestT<short>()::pt == '\0') {
    ConstCastTestT<short>();
  }
  if (ConstCastTestT<short>()::pl == '\0') {
    ConstCastTestT<short>();
  }
  return;
}

Assistant:

void ConstCastTestT()
	{
		static const bool b = ConstSafeInt<T>();
		static const wchar_t w = ConstSafeInt<T>();
		static const char c = ConstSafeInt<T>();
		static const signed char sc = ConstSafeInt<T>();
		static const unsigned char uc = ConstSafeInt<T>();
		static const signed short s = ConstSafeInt<T>();
		static const unsigned short us = ConstSafeInt<T>();
		static const signed int i = ConstSafeInt<T>();
		static const unsigned int ui = ConstSafeInt<T>();
		static const signed long l = ConstSafeInt<T>();
		static const unsigned long ul = ConstSafeInt<T>();
		static const signed long long ll = ConstSafeInt<T>();
		static const unsigned long long ull = ConstSafeInt<T>();
		static const size_t st = ConstSafeInt<T>();
		static const ptrdiff_t pt = ConstSafeInt<T>();

		// Also catch the useless unary + operator
		static const int pl = +ConstSafeInt<T>();
	}